

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deString.c
# Opt level: O2

deUint32 deStringHash(char *str)

{
  char cVar1;
  deUint32 dVar2;
  
  dVar2 = 0x1505;
  while( true ) {
    cVar1 = *str;
    if (cVar1 == '\0') break;
    str = str + 1;
    dVar2 = dVar2 * 0x21 + (int)cVar1;
  }
  return dVar2;
}

Assistant:

DE_BEGIN_EXTERN_C

/*--------------------------------------------------------------------*//*!
 * \brief Compute hash from string.
 * \param str	String to compute hash value for.
 * \return Computed hash value.
 *//*--------------------------------------------------------------------*/
deUint32 deStringHash (const char* str)
{
	/* \note [pyry] This hash is used in DT_GNU_HASH and is proven
	to be robust for symbol hashing. */
	/* \see http://sources.redhat.com/ml/binutils/2006-06/msg00418.html */
	deUint32 hash = 5381;
	unsigned int c;

	DE_ASSERT(str);
	while ((c = (unsigned int)*str++) != 0)
		hash = (hash << 5) + hash + c;

	return hash;
}